

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWmonitor ** glfwGetMonitors(int *count)

{
  int *count_local;
  
  if (count != (int *)0x0) {
    *count = 0;
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      count_local = (int *)0x0;
    }
    else {
      *count = _glfw.monitorCount;
      count_local = (int *)_glfw.monitors;
    }
    return (GLFWmonitor **)count_local;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/build_O0/_deps/glfw-src/src/monitor.c"
                ,0x12e,"GLFWmonitor **glfwGetMonitors(int *)");
}

Assistant:

GLFWAPI GLFWmonitor** glfwGetMonitors(int* count)
{
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    *count = _glfw.monitorCount;
    return (GLFWmonitor**) _glfw.monitors;
}